

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O1

void __thiscall rw::PluginList::streamWrite(PluginList *this,Stream *stream,void *object)

{
  LLLink *pLVar1;
  int iVar2;
  LLLink *pLVar3;
  
  iVar2 = streamGetSize(this,object);
  writeChunkHeader(stream,3,iVar2);
  pLVar1 = (this->plugins).link.next;
  while (pLVar3 = pLVar1, pLVar3 != &(this->plugins).link) {
    pLVar1 = pLVar3->next;
    if (pLVar3[-2].next != (LLLink *)0x0) {
      iVar2 = (*(code *)pLVar3[-2].next)
                        (object,*(undefined4 *)&pLVar3[-6].prev,
                         *(undefined4 *)((long)&pLVar3[-6].prev + 4));
      if (0 < iVar2) {
        writeChunkHeader(stream,*(int32 *)&pLVar3[-5].next,iVar2);
        (*(code *)pLVar3[-3].prev)
                  (stream,iVar2,object,*(undefined4 *)&pLVar3[-6].prev,
                   *(undefined4 *)((long)&pLVar3[-6].prev + 4));
      }
    }
  }
  return;
}

Assistant:

void
PluginList::streamWrite(Stream *stream, void *object)
{
	int size = this->streamGetSize(object);
	writeChunkHeader(stream, ID_EXTENSION, size);
	FORLIST(lnk, this->plugins){
		Plugin *p = PLG(lnk);
		if(p->getSize == nil ||
		   (size = p->getSize(object, p->offset, p->size)) <= 0)
			continue;
		writeChunkHeader(stream, p->id, size);
		p->write(stream, size, object, p->offset, p->size);
	}
}